

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool nlohmann::operator<(const_reference lhs,const_reference rhs)

{
  __synth3way_t<unsigned_char> _Var1;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_RSI;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_RDI;
  undefined1 auVar2 [16];
  undefined1 in_ZMM0 [64];
  value_t rhs_type;
  value_t lhs_type;
  undefined5 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcd;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 in_stack_ffffffffffffffcf;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  __unspec local_20;
  type local_1f;
  __unspec local_1e;
  type local_1d;
  __unspec local_1c;
  type local_1b;
  value_t local_1a;
  value_t local_19;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_18;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar3;
  
  auVar2 = in_ZMM0._0_16_;
  local_18 = in_RSI;
  local_19 = basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::type(in_RDI);
  local_1a = basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::type(local_18);
  if (local_19 == local_1a) {
    switch((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)local_19) {
    case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
      bVar3 = false;
      break;
    case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
      local_1d = (type)std::
                       operator<=><std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                                 ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                                   *)CONCAT17(in_stack_ffffffffffffffcf,
                                              CONCAT16(in_stack_ffffffffffffffce,
                                                       CONCAT15(in_stack_ffffffffffffffcd,
                                                                in_stack_ffffffffffffffc8))),
                                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                                   *)0x18d310);
      std::__cmp_cat::__unspec::__unspec(&local_1e,(__unspec *)0x0);
      bVar3 = std::operator<(local_1d);
      break;
    case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2:
      local_1b = (type)std::
                       operator<=><nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                                 ((vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                   *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                                  (vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                   *)in_RDI);
      std::__cmp_cat::__unspec::__unspec(&local_1c,(__unspec *)0x0);
      bVar3 = std::operator<(local_1b);
      break;
    case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3:
      local_1f = (type)std::operator<=><char,std::char_traits<char>,std::allocator<char>>
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(ulong)local_19);
      std::__cmp_cat::__unspec::__unspec(&local_20,(__unspec *)0x0);
      bVar3 = std::operator<(local_1f);
      break;
    case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4:
      bVar3 = ((in_RDI->m_value).boolean & 1U) < ((local_18->m_value).boolean & 1U);
      break;
    case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5:
      bVar3 = (in_RDI->m_value).number_integer < (local_18->m_value).number_integer;
      break;
    case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6:
      bVar3 = (in_RDI->m_value).object < (local_18->m_value).object;
      break;
    case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7:
      bVar3 = (in_RDI->m_value).number_float < (local_18->m_value).number_float;
      break;
    case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8:
      _Var1 = std::operator<=><unsigned_char,std::allocator<unsigned_char>>
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
      std::__cmp_cat::__unspec::__unspec((__unspec *)&stack0xffffffffffffffde,(__unspec *)0x0);
      bVar3 = std::operator<(_Var1._M_value);
      break;
    case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x9:
    default:
      bVar3 = false;
    }
  }
  else if ((local_19 == number_integer) && (local_1a == number_float)) {
    bVar3 = (double)(in_RDI->m_value).number_integer < (local_18->m_value).number_float;
  }
  else if ((local_19 == number_float) && (local_1a == number_integer)) {
    bVar3 = (in_RDI->m_value).number_float < (double)(local_18->m_value).number_integer;
  }
  else if ((local_19 == number_unsigned) && (local_1a == number_float)) {
    auVar2 = vcvtusi2sd_avx512f(auVar2,(in_RDI->m_value).object);
    bVar3 = auVar2._0_8_ < (local_18->m_value).number_float;
  }
  else if ((local_19 == number_float) && (local_1a == number_unsigned)) {
    auVar2 = vcvtusi2sd_avx512f(auVar2,(local_18->m_value).object);
    bVar3 = (in_RDI->m_value).number_float < auVar2._0_8_;
  }
  else if ((local_19 == number_integer) && (local_1a == number_unsigned)) {
    bVar3 = (in_RDI->m_value).number_integer < (local_18->m_value).number_integer;
  }
  else if ((local_19 == number_unsigned) && (local_1a == number_integer)) {
    bVar3 = (in_RDI->m_value).number_integer < (local_18->m_value).number_integer;
  }
  else {
    bVar3 = detail::operator<((value_t)((ulong)in_RDI >> 0x38),(value_t)((ulong)in_RDI >> 0x30));
  }
  return bVar3;
}

Assistant:

friend bool operator<(const_reference lhs, const_reference rhs) noexcept
    {
        const auto lhs_type = lhs.type();
        const auto rhs_type = rhs.type();

        if (lhs_type == rhs_type)
        {
            switch (lhs_type)
            {
                case value_t::array:
                    // note parentheses are necessary, see
                    // https://github.com/nlohmann/json/issues/1530
                    return (*lhs.m_value.array) < (*rhs.m_value.array);

                case value_t::object:
                    return (*lhs.m_value.object) < (*rhs.m_value.object);

                case value_t::null:
                    return false;

                case value_t::string:
                    return (*lhs.m_value.string) < (*rhs.m_value.string);

                case value_t::boolean:
                    return (lhs.m_value.boolean) < (rhs.m_value.boolean);

                case value_t::number_integer:
                    return (lhs.m_value.number_integer) < (rhs.m_value.number_integer);

                case value_t::number_unsigned:
                    return (lhs.m_value.number_unsigned) < (rhs.m_value.number_unsigned);

                case value_t::number_float:
                    return (lhs.m_value.number_float) < (rhs.m_value.number_float);

                case value_t::binary:
                    return (*lhs.m_value.binary) < (*rhs.m_value.binary);

                case value_t::discarded:
                default:
                    return false;
            }
        }
        else if (lhs_type == value_t::number_integer && rhs_type == value_t::number_float)
        {
            return static_cast<number_float_t>(lhs.m_value.number_integer) < rhs.m_value.number_float;
        }
        else if (lhs_type == value_t::number_float && rhs_type == value_t::number_integer)
        {
            return lhs.m_value.number_float < static_cast<number_float_t>(rhs.m_value.number_integer);
        }
        else if (lhs_type == value_t::number_unsigned && rhs_type == value_t::number_float)
        {
            return static_cast<number_float_t>(lhs.m_value.number_unsigned) < rhs.m_value.number_float;
        }
        else if (lhs_type == value_t::number_float && rhs_type == value_t::number_unsigned)
        {
            return lhs.m_value.number_float < static_cast<number_float_t>(rhs.m_value.number_unsigned);
        }
        else if (lhs_type == value_t::number_integer && rhs_type == value_t::number_unsigned)
        {
            return lhs.m_value.number_integer < static_cast<number_integer_t>(rhs.m_value.number_unsigned);
        }
        else if (lhs_type == value_t::number_unsigned && rhs_type == value_t::number_integer)
        {
            return static_cast<number_integer_t>(lhs.m_value.number_unsigned) < rhs.m_value.number_integer;
        }

        // We only reach this line if we cannot compare values. In that case,
        // we compare types. Note we have to call the operator explicitly,
        // because MSVC has problems otherwise.
        return operator<(lhs_type, rhs_type);
    }